

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf2.c
# Opt level: O0

size_t gf2Create_keep(size_t m)

{
  size_t sVar1;
  ulong in_RDI;
  size_t n1;
  size_t n;
  
  sVar1 = utilMax(2,0x40,0x60);
  return (in_RDI + 0x3f >> 6) * 0x10 + (long)(int)(uint)((in_RDI & 0x3f) == 0) * 8 + 0x90 + sVar1;
}

Assistant:

size_t gf2Create_keep(size_t m)
{
	const size_t n = W_OF_B(m);
	const size_t n1 = n + (m % B_PER_W == 0);
	return sizeof(qr_o) + O_OF_W(n1 + n) + 
		utilMax(2, 
			sizeof(gf2_trinom_st),
			sizeof(gf2_pentanom_st));
}